

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O3

void __thiscall spvtools::opt::DominatorTree::ResetDFNumbering(DominatorTree *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  int index;
  undefined4 local_bc;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_bc = 0;
  ppDVar2 = (this->roots_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppDVar1 = (this->roots_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar2 != ppDVar1) {
    do {
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<const_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_*(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:357:18)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<const_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_*(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:357:18)>
                 ::_M_manager;
      local_98._8_8_ = 0;
      local_b8._M_unused._M_object = &local_bc;
      local_80 = std::
                 _Function_handler<void_(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:349:18)>
                 ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:349:18)>
                 ::_M_manager;
      local_b8._8_8_ = 0;
      local_a0 = std::
                 _Function_handler<void_(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:353:19)>
                 ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:353:19)>
                 ::_M_manager;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<bool_(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:60:29)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::DominatorTreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.cpp:60:29)>
                 ::_M_manager;
      local_98._M_unused._M_object = local_b8._M_unused._M_object;
      CFA<spvtools::opt::DominatorTreeNode>::DepthFirstTraversal
                (*ppDVar2,(get_blocks_func *)&local_58,
                 (function<void_(const_spvtools::opt::DominatorTreeNode_*)> *)&local_98,
                 (function<void_(const_spvtools::opt::DominatorTreeNode_*)> *)&local_b8,
                 (function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      ppDVar2 = ppDVar2 + 1;
    } while (ppDVar2 != ppDVar1);
  }
  return;
}

Assistant:

void DominatorTree::ResetDFNumbering() {
  int index = 0;
  auto preFunc = [&index](const DominatorTreeNode* node) {
    const_cast<DominatorTreeNode*>(node)->dfs_num_pre_ = ++index;
  };

  auto postFunc = [&index](const DominatorTreeNode* node) {
    const_cast<DominatorTreeNode*>(node)->dfs_num_post_ = ++index;
  };

  auto getSucc = [](const DominatorTreeNode* node) { return &node->children_; };

  for (auto root : roots_) DepthFirstSearch(root, getSucc, preFunc, postFunc);
}